

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t lzx_huffman_init(huffman *hf,size_t len_size,wchar_t tbl_bits)

{
  uchar *puVar1;
  uint16_t *puVar2;
  htree_t *phVar3;
  wchar_t wVar4;
  
  puVar1 = hf->bitlen;
  if ((puVar1 == (uchar *)0x0) || (hf->len_size != (wchar_t)len_size)) {
    free(puVar1);
    puVar1 = (uchar *)calloc(len_size,1);
    hf->bitlen = puVar1;
    if (puVar1 != (uchar *)0x0) {
      hf->len_size = (wchar_t)len_size;
      goto LAB_00124b43;
    }
LAB_00124ba0:
    wVar4 = L'\xffffffe2';
  }
  else {
    memset(puVar1,0,len_size);
LAB_00124b43:
    if (hf->tbl == (uint16_t *)0x0) {
      wVar4 = L'\n';
      if (tbl_bits < L'\n') {
        wVar4 = tbl_bits;
      }
      puVar2 = (uint16_t *)malloc(2L << ((byte)wVar4 & 0x3f));
      hf->tbl = puVar2;
      if (puVar2 == (uint16_t *)0x0) goto LAB_00124ba0;
      hf->tbl_bits = tbl_bits;
    }
    if ((L'\n' < tbl_bits) && (hf->tree == (htree_t *)0x0)) {
      wVar4 = 1 << ((char)tbl_bits - 6U & 0x1f);
      hf->tree_avail = wVar4;
      phVar3 = (htree_t *)malloc((ulong)(uint)wVar4 << 2);
      hf->tree = phVar3;
      if (phVar3 == (htree_t *)0x0) goto LAB_00124ba0;
    }
    wVar4 = L'\0';
  }
  return wVar4;
}

Assistant:

static int
lzx_huffman_init(struct huffman *hf, size_t len_size, int tbl_bits)
{
	int bits;

	if (hf->bitlen == NULL || hf->len_size != (int)len_size) {
		free(hf->bitlen);
		hf->bitlen = calloc(len_size,  sizeof(hf->bitlen[0]));
		if (hf->bitlen == NULL)
			return (ARCHIVE_FATAL);
		hf->len_size = (int)len_size;
	} else
		memset(hf->bitlen, 0, len_size *  sizeof(hf->bitlen[0]));
	if (hf->tbl == NULL) {
		if (tbl_bits < HTBL_BITS)
			bits = tbl_bits;
		else
			bits = HTBL_BITS;
		hf->tbl = malloc(((size_t)1 << bits) * sizeof(hf->tbl[0]));
		if (hf->tbl == NULL)
			return (ARCHIVE_FATAL);
		hf->tbl_bits = tbl_bits;
	}
	if (hf->tree == NULL && tbl_bits > HTBL_BITS) {
		hf->tree_avail = 1 << (tbl_bits - HTBL_BITS + 4);
		hf->tree = malloc(hf->tree_avail * sizeof(hf->tree[0]));
		if (hf->tree == NULL)
			return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}